

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cpp
# Opt level: O2

void __thiscall
libcellml::Generator::GeneratorImpl::updateVariableInfoSizes
          (GeneratorImpl *this,size_t *componentSize,size_t *nameSize,size_t *unitsSize,
          AnalyserVariablePtr *variable)

{
  size_type sVar1;
  size_type sVar2;
  ulong uVar3;
  VariablePtr variableVariable;
  Variable local_80;
  __shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  
  AnalyserVariable::variable
            ((AnalyserVariable *)&local_80.super_enable_shared_from_this<libcellml::Variable>);
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Variable,void>
            (local_60,(__shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2> *)
                      &local_80.super_enable_shared_from_this<libcellml::Variable>);
  owningComponent((ParentedEntityConstPtr *)&local_80);
  NamedEntity::name_abi_cxx11_
            (&local_50,
             (NamedEntity *)
             local_80.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity);
  sVar1 = local_50._M_string_length;
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_80.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  NamedEntity::name_abi_cxx11_
            (&local_50,
             &(local_80.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
               super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_NamedEntity);
  sVar2 = local_50._M_string_length;
  std::__cxx11::string::~string((string *)&local_50);
  Variable::units(&local_80);
  NamedEntity::name_abi_cxx11_
            (&local_50,
             (NamedEntity *)
             local_80.super_NamedEntity.super_ParentedEntity.super_Entity._vptr_Entity);
  std::__cxx11::string::~string((string *)&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_80.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
  uVar3 = sVar1 + 1;
  if (sVar1 + 1 < *componentSize) {
    uVar3 = *componentSize;
  }
  *componentSize = uVar3;
  uVar3 = sVar2 + 1;
  if (sVar2 + 1 < *nameSize) {
    uVar3 = *nameSize;
  }
  *nameSize = uVar3;
  uVar3 = local_50._M_string_length + 1;
  if (local_50._M_string_length + 1 < *unitsSize) {
    uVar3 = *unitsSize;
  }
  *unitsSize = uVar3;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_80.super_enable_shared_from_this<libcellml::Variable>._M_weak_this.
              super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Generator::GeneratorImpl::updateVariableInfoSizes(size_t &componentSize,
                                                       size_t &nameSize,
                                                       size_t &unitsSize,
                                                       const AnalyserVariablePtr &variable) const
{
    auto variableVariable = variable->variable();
    auto variableComponentSize = owningComponent(variableVariable)->name().length() + 1;
    auto variableNameSize = variableVariable->name().length() + 1;
    auto variableUnitsSize = variableVariable->units()->name().length() + 1;
    // Note: +1 to account for the end of string termination.

    componentSize = (componentSize > variableComponentSize) ? componentSize : variableComponentSize;
    nameSize = (nameSize > variableNameSize) ? nameSize : variableNameSize;
    unitsSize = (unitsSize > variableUnitsSize) ? unitsSize : variableUnitsSize;
}